

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O2

size_t rtc::unescape(char *buffer,size_t buflen,char *source,size_t srclen,char escape)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  FatalMessage local_190;
  
  if (buffer != (char *)0x0) {
    if (buflen == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      uVar3 = 0;
      while ((uVar3 < srclen && (uVar1 + 1 < buflen))) {
        uVar4 = uVar3 + 1;
        cVar5 = source[uVar3];
        if (uVar4 < srclen && cVar5 == escape) {
          cVar5 = source[uVar3 + 1];
          uVar4 = uVar3 + 2;
        }
        buffer[uVar1] = cVar5;
        uVar1 = uVar1 + 1;
        uVar3 = uVar4;
      }
      buffer[uVar1] = '\0';
    }
    return uVar1;
  }
  FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x33);
  poVar2 = std::operator<<((ostream *)&local_190,"Check failed: buffer");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"# ");
  FatalMessage::~FatalMessage(&local_190);
}

Assistant:

size_t unescape(char * buffer, size_t buflen,
                const char * source, size_t srclen,
                char escape) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  if (buflen <= 0)
    return 0;

  size_t srcpos = 0, bufpos = 0;
  while ((srcpos < srclen) && (bufpos + 1 < buflen)) {
    char ch = source[srcpos++];
    if ((ch == escape) && (srcpos < srclen)) {
      ch = source[srcpos++];
    }
    buffer[bufpos++] = ch;
  }
  buffer[bufpos] = '\0';
  return bufpos;
}